

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O2

void __thiscall
burst::algorithm::bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>>::
bitap<std::__cxx11::string>
          (bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_10._M_current = (pattern->_M_dataplus)._M_p;
  std::
  make_shared<burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32ul>,256ul>>const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,&local_10);
  if (*(ulong *)(*(long *)this + 0x800) < 0x21) {
    return;
  }
  __assert_fail("m_bitmask_table->length() <= bitmask_size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/searching/bitap.hpp"
                ,0x4c,
                "burst::algorithm::bitap<char, std::bitset<32>>::bitap(const ForwardRange &) [Value = char, Bitmask = std::bitset<32>, Map = std::array<std::bitset<32>, 256>, ForwardRange = std::basic_string<char>]"
               );
}

Assistant:

explicit bitap (const ForwardRange & pattern):
                m_bitmask_table
                (
                    std::make_shared<const bitmask_table_type>(pattern.begin(), pattern.end())
                )
            {
                BOOST_ASSERT(m_bitmask_table->length() <= bitmask_size);
            }